

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  AudioLogger audioLogger;
  deque<int,_std::allocator<int>_> keyPressedQueue;
  thread keyReader;
  size_t totalSize_bytes;
  time_point tEnd;
  time_point tStart;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  Parameters parameters;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> nTimes;
  ofstream fout;
  AudioLogger local_390;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  thread local_330;
  undefined8 local_328;
  undefined8 local_320;
  time_point local_318;
  _Any_data local_310;
  code *local_300;
  code *local_2f8;
  anon_class_24_3_f7923e7b_for__M_head_impl local_2f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  _Any_data local_2a8;
  undefined1 local_298 [16];
  undefined4 local_288;
  undefined4 uStack_284;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined4 local_270;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_260;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  printf("Usage: %s output.kbd [-cN]\n",*argv);
  puts("    -cN - select capture device N");
  puts("    -CN - number N of capture channels N");
  putchar(10);
  if (argc < 2) {
    return -0x7f;
  }
  parseCmdArguments_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d8,argc,argv);
  local_230._0_8_ = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_2d8,(key_type *)local_230);
  lVar6 = 0;
  if (pmVar4->_M_string_length == 0) {
LAB_0011351c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
    }
    local_230._0_8_ = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"C","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_2d8,(key_type *)local_230);
    lVar7 = 0;
    if (pmVar4->_M_string_length == 0) {
LAB_00113634:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._0_8_ != local_220) {
        operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
      }
      local_318.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_320 = std::chrono::_V2::system_clock::now();
      local_328 = 0;
      local_348 = (undefined1  [16])0x0;
      local_358 = (undefined1  [16])0x0;
      local_368 = (undefined1  [16])0x0;
      local_378 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   )0x0;
      local_388 = (undefined1  [16])0x0;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
                ((_Deque_base<int,_std::allocator<int>_> *)local_388,0);
      local_260._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_260._M_impl.super__Rb_tree_header._M_header;
      local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_260._M_impl.super__Rb_tree_header._M_header._M_right =
           local_260._M_impl.super__Rb_tree_header._M_header._M_left;
      printf("Recording %d frames per key press\n",0xb);
      std::ofstream::ofstream(local_230,argv[1],_S_bin);
      std::ostream::write(local_230,0x11d01c);
      AudioLogger::AudioLogger(&local_390);
      local_310._8_8_ = 0;
      local_310._M_unused._M_object = operator_new(0x28);
      *(undefined8 **)local_310._M_unused._0_8_ = &local_320;
      *(_Deque_base<int,_std::allocator<int>_> **)((long)local_310._M_unused._0_8_ + 8) =
           (_Deque_base<int,_std::allocator<int>_> *)local_388;
      *(undefined1 **)((long)local_310._M_unused._0_8_ + 0x10) = local_230;
      *(undefined8 **)((long)local_310._M_unused._0_8_ + 0x18) = &local_328;
      *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        **)((long)local_310._M_unused._0_8_ + 0x20) = &local_260;
      local_2f8 = std::
                  _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record.cpp:47:37)>
                  ::_M_invoke;
      local_300 = std::
                  _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record.cpp:47:37)>
                  ::_M_manager;
      local_298 = (undefined1  [16])0x0;
      local_2a8 = (_Any_data)0x0;
      local_288 = 0xffffffff;
      uStack_284 = 0xffffffff;
      uStack_280 = 0xffffffffffffffff;
      local_278 = 0x100000000;
      local_270 = 0x447a0000;
      std::
      function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
      ::operator=((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                   *)&local_2a8,
                  (function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                   *)&local_310);
      local_288 = (undefined4)lVar6;
      uStack_284 = (undefined4)lVar7;
      uStack_280 = 16000;
      local_270 = 0x42c80000;
      bVar2 = AudioLogger::install(&local_390,(Parameters *)&local_2a8);
      if (!bVar2) {
        fwrite("Failed to install audio logger\n",0x1f,1,_stderr);
        if ((code *)local_298._0_8_ != (code *)0x0) {
          (*(code *)local_298._0_8_)(&local_2a8,&local_2a8,__destroy_functor);
        }
        if (local_300 != (code *)0x0) {
          (*local_300)(&local_310,&local_310,__destroy_functor);
        }
        AudioLogger::~AudioLogger(&local_390);
        local_230._0_8_ = _VTT;
        *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _SDL_GetNumAudioDevices;
        std::filebuf::~filebuf((filebuf *)(local_230 + 8));
        std::ios_base::~ios_base(local_138);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_260);
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                  ((_Deque_base<int,_std::allocator<int>_> *)local_388);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_2d8);
        return -1;
      }
      putchar(10);
      puts("To stop capturing press Ctrl+C");
      puts(
          "On some systems (e.g. MacOS), this may not work. In this case, you have to kill the process manually"
          );
      putchar(10);
      local_2f0.tStart = &local_318;
      local_2f0.keyPressedQueue = (deque<int,_std::allocator<int>_> *)local_388;
      local_2f0.audioLogger = &local_390;
      std::thread::thread<main::__1,,void>(&local_330,&local_2f0);
      do {
        local_2f0.tStart = (time_point *)0x0;
        local_2f0.keyPressedQueue = (deque<int,_std::allocator<int>_> *)0x5f5e100;
        do {
          iVar3 = nanosleep((timespec *)&local_2f0,(timespec *)&local_2f0);
          if (iVar3 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      } while( true );
    }
    local_388._0_8_ = &local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"C","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_2d8,(key_type *)local_388);
    pcVar1 = (pmVar4->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    *piVar5 = 0;
    lVar7 = strtol(pcVar1,(char **)&local_2a8,10);
    if ((char *)local_2a8._M_unused._0_8_ != pcVar1) {
      if (((int)lVar7 == lVar7) && (*piVar5 != 0x22)) {
        if (*piVar5 == 0) {
          *piVar5 = iVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._0_8_ != &local_378) {
          operator_delete((void *)local_388._0_8_,local_378._M_allocated_capacity + 1);
        }
        goto LAB_00113634;
      }
      goto LAB_00113960;
    }
  }
  else {
    local_388._0_8_ = &local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"c","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_2d8,(key_type *)local_388);
    pcVar1 = (pmVar4->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol(pcVar1,(char **)&local_2a8,10);
    if ((char *)local_2a8._M_unused._0_8_ == pcVar1) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar6 == lVar6) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._0_8_ != &local_378) {
        operator_delete((void *)local_388._0_8_,local_378._M_allocated_capacity + 1);
      }
      goto LAB_0011351c;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_00113960:
  uVar8 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar8);
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s output.kbd [-cN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -CN - number N of capture channels N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int nChannels = argm["C"].empty() ? 0 : std::stoi(argm["C"]);

    auto tStart = std::chrono::high_resolution_clock::now();
    auto tEnd = std::chrono::high_resolution_clock::now();

    size_t totalSize_bytes = 0;
    std::deque<int> keyPressedQueue;
    std::map<int, int> nTimes;
    printf("Recording %d frames per key press\n", kBufferSizeTrain_frames);

    std::ofstream fout(argv[1], std::ios::binary);
    fout.write((char *)(&kBufferSizeTrain_frames), sizeof(kBufferSizeTrain_frames));

    AudioLogger audioLogger;
    AudioLogger::Callback cbAudio = [&](const auto & frames) {
        tEnd = std::chrono::high_resolution_clock::now();

        int keyPressed = keyPressedQueue.front();
        keyPressedQueue.pop_front();

        fout.write((char *)(&keyPressed), sizeof(keyPressed));
        for (const auto & frame : frames) {
            totalSize_bytes += sizeof(frame[0])*frame.size();
            fout.write((char *)(frame.data()), sizeof(frame[0])*frame.size());
            fout.flush();
        }
        ++nTimes[keyPressed];

        printf("Last recorded key - %3d '%s'. Total times recorded so far - %3d. Total data saved: %g MB\n",
               keyPressed, kKeyText.at(keyPressed), nTimes[keyPressed], ((float)(totalSize_bytes)/1024.0f/1024.0f));

        keyPressed = -1;
    };

    AudioLogger::Parameters parameters;
    parameters.callback = std::move(cbAudio);
    parameters.captureId = captureId;
    parameters.nChannels = nChannels;
    parameters.sampleRate = kSampleRate;
    parameters.freqCutoff_Hz = kFreqCutoff_Hz;

    if (audioLogger.install(std::move(parameters)) == false) {
        fprintf(stderr, "Failed to install audio logger\n");
        return -1;
    }

    printf("\n");
    printf("To stop capturing press Ctrl+C\n");
    printf("On some systems (e.g. MacOS), this may not work. In this case, you have to kill the process manually\n");
    printf("\n");

    std::thread keyReader = std::thread([&]() {
        struct termios oldt, newt;
        tcgetattr ( STDIN_FILENO, &oldt );
        newt = oldt;
        newt.c_lflag &= ~( ICANON | ECHO );
        tcsetattr ( STDIN_FILENO, TCSANOW, &newt );
        while (true) {
            int key = getchar();
            tStart = std::chrono::high_resolution_clock::now();
            keyPressedQueue.push_back(key);
            if (audioLogger.record(kBufferSizeTrain_s, 2) == false) {
                fprintf(stderr, "error : failed to record\n");
            }
        }
        tcsetattr ( STDIN_FILENO, TCSANOW, &oldt );
    });

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }

    keyReader.join();

    fout.close();

    return 0;
}